

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int TPZShapeHDivConstant<pzshape::TPZShapeCube>::NHDivShapeF(TPZShapeData *data)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = 6;
  uVar2 = (uint)(data->fHDivNumConnectShape).super_TPZVec<int>.fNElements;
  if (0xc < (int)uVar2) {
    iVar1 = 0;
    uVar3 = 0xc;
    do {
      iVar1 = iVar1 + (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    iVar1 = iVar1 + 6;
  }
  return iVar1;
}

Assistant:

inline int64_t size() const { return fNElements; }